

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int floatx80_compare_internal(floatx80 a,floatx80 b,int is_quiet,float_status *status)

{
  ushort uVar1;
  ushort uVar2;
  unkuint10 Var3;
  unkuint10 Var4;
  _Bool _Var5;
  byte bVar6;
  byte bVar7;
  int32_t iVar8;
  int iVar9;
  uint64_t uVar10;
  uint64_t b1;
  uint64_t a1;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  flag bSign;
  flag aSign;
  float_status *status_local;
  int is_quiet_local;
  floatx80 b_local;
  floatx80 a_local;
  
  b1 = b.low;
  a1 = a.low;
  uVar2 = b.high;
  uVar1 = a.high;
  Var4 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var4;
  a_00.high = (short)(Var4 >> 0x40);
  _Var5 = floatx80_invalid_encoding(a_00);
  if (!_Var5) {
    Var3 = b._0_10_;
    a_01._10_6_ = 0;
    a_01.low = (long)Var3;
    a_01.high = (short)(Var3 >> 0x40);
    _Var5 = floatx80_invalid_encoding(a_01);
    if (!_Var5) {
      a_02._10_6_ = 0;
      a_02.low = (long)Var4;
      a_02.high = (short)(Var4 >> 0x40);
      iVar8 = extractFloatx80Exp(a_02);
      if (((iVar8 == 0x7fff) &&
          (a_03._10_6_ = 0, a_03.low = (long)Var4, a_03.high = (short)(Var4 >> 0x40),
          uVar10 = extractFloatx80Frac(a_03), (uVar10 & 0x7fffffffffffffff) != 0)) ||
         ((a_04._10_6_ = 0, a_04.low = (long)Var3, a_04.high = (short)(Var3 >> 0x40),
          iVar8 = extractFloatx80Exp(a_04), iVar8 == 0x7fff &&
          (a_05._10_6_ = 0, a_05.low = (long)Var3, a_05.high = (short)(Var3 >> 0x40),
          uVar10 = extractFloatx80Frac(a_05), (uVar10 & 0x7fffffffffffffff) != 0)))) {
        if (((is_quiet == 0) ||
            (a_06._10_6_ = 0, a_06.low = (long)Var4, a_06.high = (short)(Var4 >> 0x40),
            iVar9 = floatx80_is_signaling_nan_tricore(a_06,status), iVar9 != 0)) ||
           (a_07._10_6_ = 0, a_07.low = (long)Var3, a_07.high = (short)(Var3 >> 0x40),
           iVar9 = floatx80_is_signaling_nan_tricore(a_07,status), iVar9 != 0)) {
          float_raise_tricore('\x01',status);
        }
        return 2;
      }
      a_08._10_6_ = 0;
      a_08.low = (long)Var4;
      a_08.high = (short)(Var4 >> 0x40);
      bVar6 = extractFloatx80Sign(a_08);
      a_09._10_6_ = 0;
      a_09.low = (long)Var3;
      a_09.high = (short)(Var3 >> 0x40);
      bVar7 = extractFloatx80Sign(a_09);
      if (bVar6 == bVar7) {
        if ((a1 == b1) && (uVar1 == uVar2)) {
          return 0;
        }
        bVar7 = lt128((ulong)uVar1,a1,(ulong)uVar2,b1);
        return (uint)(bVar6 ^ bVar7) * -2 + 1;
      }
      if ((((uVar1 | uVar2) & 0x7fff) == 0) && (a1 == 0 && b1 == 0)) {
        return 0;
      }
      return (uint)bVar6 * -2 + 1;
    }
  }
  float_raise_tricore('\x01',status);
  return 2;
}

Assistant:

static inline int floatx80_compare_internal(floatx80 a, floatx80 b,
                                            int is_quiet, float_status *status)
{
    flag aSign, bSign;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return float_relation_unordered;
    }
    if (( ( extractFloatx80Exp( a ) == 0x7fff ) &&
          ( extractFloatx80Frac( a )<<1 ) ) ||
        ( ( extractFloatx80Exp( b ) == 0x7fff ) &&
          ( extractFloatx80Frac( b )<<1 ) )) {
        if (!is_quiet ||
            floatx80_is_signaling_nan(a, status) ||
            floatx80_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return float_relation_unordered;
    }
    aSign = extractFloatx80Sign( a );
    bSign = extractFloatx80Sign( b );
    if ( aSign != bSign ) {

        if ( ( ( (uint16_t) ( ( a.high | b.high ) << 1 ) ) == 0) &&
             ( ( a.low | b.low ) == 0 ) ) {
            /* zero case */
            return float_relation_equal;
        } else {
            return 1 - (2 * aSign);
        }
    } else {
        if (a.low == b.low && a.high == b.high) {
            return float_relation_equal;
        } else {
            return 1 - 2 * (aSign ^ ( lt128( a.high, a.low, b.high, b.low ) ));
        }
    }
}